

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void fl_text_drag_me(int pos,Fl_Text_Display *d)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  fd_set *in_RCX;
  fd_set *pfVar4;
  Fl_Text_Buffer *this;
  fd_set *in_R8;
  timeval *in_R9;
  
  pfVar4 = (fd_set *)(ulong)(uint)pos;
  iVar1 = d->dragType;
  if (iVar1 == 2) {
    if (pos < d->dragPos) {
      iVar1 = Fl_Text_Buffer::line_start(d->mBuffer,pos);
      Fl_Text_Display::insert_position(d,iVar1);
      this = d->mBuffer;
      iVar1 = Fl_Text_Buffer::line_start(this,pos);
      iVar3 = Fl_Text_Buffer::line_end(d->mBuffer,d->dragPos);
      pfVar4 = (fd_set *)(ulong)(iVar3 + 1);
    }
    else {
      iVar1 = Fl_Text_Buffer::line_end(d->mBuffer,pos);
      Fl_Text_Display::insert_position(d,iVar1 + 1);
      this = d->mBuffer;
      iVar1 = Fl_Text_Buffer::line_start(this,d->dragPos);
      iVar3 = Fl_Text_Buffer::line_end(d->mBuffer,pos);
      pfVar4 = (fd_set *)(ulong)(iVar3 + 1);
    }
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 != 0) {
        return;
      }
      uVar2 = d->dragPos;
      if (pos < (int)uVar2) {
        pfVar4 = (fd_set *)(ulong)uVar2;
        uVar2 = pos;
      }
      Fl_Text_Buffer::select(d->mBuffer,uVar2,pfVar4,in_RCX,in_R8,in_R9);
      Fl_Text_Display::insert_position(d,pos);
      return;
    }
    if (pos < d->dragPos) {
      iVar1 = Fl_Text_Buffer::word_start(d->mBuffer,pos);
      Fl_Text_Display::insert_position(d,iVar1);
      this = d->mBuffer;
      iVar1 = Fl_Text_Buffer::word_start(this,pos);
      uVar2 = Fl_Text_Buffer::word_end(d->mBuffer,d->dragPos);
    }
    else {
      iVar1 = Fl_Text_Buffer::word_end(d->mBuffer,pos);
      Fl_Text_Display::insert_position(d,iVar1);
      this = d->mBuffer;
      iVar1 = Fl_Text_Buffer::word_start(this,d->dragPos);
      uVar2 = Fl_Text_Buffer::word_end(d->mBuffer,pos);
    }
    pfVar4 = (fd_set *)(ulong)uVar2;
  }
  Fl_Text_Buffer::select(this,iVar1,pfVar4,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

void fl_text_drag_me(int pos, Fl_Text_Display* d) {
  if (d->dragType == Fl_Text_Display::DRAG_CHAR) {
    if (pos >= d->dragPos) {
      d->buffer()->select(d->dragPos, pos);
    } else {
      d->buffer()->select(pos, d->dragPos);
    }
    d->insert_position(pos);
  } else if (d->dragType == Fl_Text_Display::DRAG_WORD) {
    if (pos >= d->dragPos) {
      d->insert_position(d->word_end(pos));
      d->buffer()->select(d->word_start(d->dragPos), d->word_end(pos));
    } else {
      d->insert_position(d->word_start(pos));
      d->buffer()->select(d->word_start(pos), d->word_end(d->dragPos));
    }
  } else if (d->dragType == Fl_Text_Display::DRAG_LINE) {
    if (pos >= d->dragPos) {
      d->insert_position(d->buffer()->line_end(pos)+1);
      d->buffer()->select(d->buffer()->line_start(d->dragPos),
                          d->buffer()->line_end(pos)+1);
    } else {
      d->insert_position(d->buffer()->line_start(pos));
      d->buffer()->select(d->buffer()->line_start(pos),
                          d->buffer()->line_end(d->dragPos)+1);
    }
  }
}